

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::vector3h>
          (GeomPrimvar *this,vector3h *dest,string *err)

{
  Attribute *this_00;
  half hVar1;
  bool bVar2;
  uint32_t tyid;
  value_type *pvVar3;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *this_01;
  const_reference pvVar4;
  vector3h *pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  optional<tinyusdz::value::vector3h> pv;
  allocator local_9d;
  optional<tinyusdz::value::vector3h> local_9c;
  undefined1 local_94 [4];
  undefined1 local_90 [32];
  string local_70;
  string local_50 [32];
  
  if (dest != (vector3h *)0x0) {
    this_00 = &this->_attr;
    bVar2 = Attribute::is_blocked(this_00);
    if (!bVar2) {
      bVar2 = primvar::PrimVar::has_value(&(this->_attr)._var);
      if (!bVar2) {
        if (*(pointer *)
             ((long)&(this->_attr)._var._ts._samples.
                     super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     ._M_impl.super__Vector_impl_data + 8) ==
            (this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          return (bool)'\0';
        }
        this_01 = tinyusdz::value::TimeSamples::get_samples(&(this->_attr)._var._ts);
        pvVar4 = std::
                 vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ::at(this_01,0);
        pvVar5 = tinyusdz::value::Value::as<tinyusdz::value::vector3h>(&pvVar4->value,false);
        if (pvVar5 != (vector3h *)0x0) {
          (dest->z).value = (pvVar5->z).value;
          hVar1.value = (pvVar5->y).value;
          dest->x = (half)(pvVar5->x).value;
          dest->y = (half)hVar1.value;
          return (bool)'\x01';
        }
        return (bool)'\0';
      }
      tyid = Attribute::type_id(this_00);
      bVar2 = IsSupportedGeomPrimvarType(tyid);
      if (!bVar2) {
        if (err == (string *)0x0) {
          return (bool)'\0';
        }
        std::__cxx11::string::string
                  (local_50,"Unsupported type for GeomPrimvar. type = `{}`",(allocator *)&local_9c);
        Attribute::type_name_abi_cxx11_(&local_70,this_00);
        fmt::format<std::__cxx11::string>((string *)local_90,(fmt *)local_50,&local_70,in_RCX);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        return (bool)'\0';
      }
      Attribute::get_value<tinyusdz::value::vector3h>
                ((optional<tinyusdz::value::vector3h> *)local_90,this_00);
      local_9c.has_value_ = local_90[0];
      if (local_90[0] == true) {
        local_9c.contained._4_2_ = local_90._6_2_;
        local_9c.contained._0_4_ = local_90._2_4_;
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::vector3h>::value(&local_9c);
        hVar1.value = (pvVar3->y).value;
        dest->x = (half)(pvVar3->x).value;
        dest->y = (half)hVar1.value;
        (dest->z).value = (pvVar3->z).value;
        return true;
      }
      if (err != (string *)0x0) {
        std::__cxx11::string::string
                  (local_50,
                   "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`",
                   &local_9d);
        local_94 = (undefined1  [4])0x45;
        Attribute::type_name_abi_cxx11_(&local_70,this_00);
        fmt::format<unsigned_int,std::__cxx11::string>
                  ((string *)local_90,(fmt *)local_50,(string *)local_94,(uint *)&local_70,in_R8);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        return local_90[0];
      }
      return local_90[0];
    }
  }
  if (err != (string *)0x0) {
    std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}